

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_quadrature.cc
# Opt level: O0

tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *
lf::quad::GaussLegendre
          (tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           *__return_storage_ptr__,uint num_points)

{
  exponent_type *this;
  Scalar SVar1;
  type_conflict2 tVar2;
  int iVar3;
  type e;
  Scalar *pSVar4;
  double dVar5;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  double local_528;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_520;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_510;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_500;
  double local_4f0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  int local_4d4;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_4d0;
  double local_4c0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  int local_4a4;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  double local_490;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  double local_478;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_470;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_460;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_450;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_440;
  double local_430;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_418;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_3d8;
  double local_3c8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_3c0;
  double local_3b0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_398;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_378;
  uint local_364;
  undefined1 local_360 [4];
  uint j;
  scalar_t p3;
  undefined1 local_348 [8];
  scalar_t p2;
  undefined1 local_330 [8];
  scalar_t p1;
  scalar_t pp;
  scalar_t z1;
  double local_2f8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_2f0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_2e0;
  undefined1 local_2d0 [8];
  scalar_t z;
  uint i;
  uint m;
  VectorXd weights;
  VectorXd points;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  uint local_14;
  tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *ptStack_10
  ;
  uint num_points_local;
  
  local_14 = num_points;
  ptStack_10 = __return_storage_ptr__;
  if (num_points == 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"num_points must be positive.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"num_points > 0",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x12,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"",
               (allocator<char> *)
               ((long)&points.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 7));
    lf::base::AssertionFailed(&local_240,&local_268,0x12,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&points.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 7));
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  if (GaussLegendre(unsigned_int)::kPi == '\0') {
    iVar3 = __cxa_guard_acquire(&GaussLegendre(unsigned_int)::kPi);
    if (iVar3 != 0) {
      e = boost::math::constants::
          pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>>
                    ();
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::number(&GaussLegendre::kPi,e);
      __cxa_guard_release(&GaussLegendre(unsigned_int)::kPi);
    }
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,&local_14);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&i,&local_14);
  z.m_backend._12_4_ = local_14 + 1 >> 1;
  for (z.m_backend.m_exponent = 0; (uint)z.m_backend.m_exponent < (uint)z.m_backend._12_4_;
      z.m_backend.m_exponent = z.m_backend.m_exponent + 1) {
    local_2f8 = (double)(uint)z.m_backend.m_exponent + 0.75;
    boost::multiprecision::operator*((multiprecision *)&local_2f0,&GaussLegendre::kPi,&local_2f8);
    z1.m_backend._8_8_ = (double)local_14 + 0.5;
    boost::multiprecision::operator/
              ((multiprecision *)&local_2e0,&local_2f0,(double *)&z1.m_backend.m_exponent);
    boost::multiprecision::
    cos<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
              ((multiprecision *)local_2d0,&local_2e0);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
    ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
              *)&pp.m_backend.m_exponent);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
    ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
              *)&p1.m_backend.m_exponent);
    do {
      p2.m_backend.m_exponent = 0;
      p2.m_backend.m_sign = false;
      p2.m_backend._13_3_ = 0x3ff000;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::number<double>((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                        *)local_330,(double *)&p2.m_backend.m_exponent,(type *)0x0);
      p3.m_backend.m_exponent = 0;
      p3.m_backend.m_sign = false;
      p3.m_backend._13_3_ = 0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::number<double>((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                        *)local_348,(double *)&p3.m_backend.m_exponent,(type *)0x0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)local_360);
      for (local_364 = 0; local_364 < local_14; local_364 = local_364 + 1) {
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)local_360,
                    (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)local_348);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)local_348,
                    (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)local_330);
        local_3b0 = (double)local_364 + (double)local_364 + 1.0;
        boost::multiprecision::operator*
                  ((multiprecision *)&local_3a8,&local_3b0,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)local_2d0);
        boost::multiprecision::operator*
                  ((multiprecision *)&local_398,&local_3a8,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)local_348);
        boost::multiprecision::operator*
                  ((multiprecision *)&local_3c0,&local_364,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)local_360);
        boost::multiprecision::operator-((multiprecision *)&local_388,&local_398,&local_3c0);
        local_3c8 = (double)local_364 + 1.0;
        boost::multiprecision::operator/((multiprecision *)&local_378,&local_388,&local_3c8);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)local_330,&local_378);
      }
      boost::multiprecision::operator*
                ((multiprecision *)&local_408,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2d0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)local_330);
      boost::multiprecision::operator-
                ((multiprecision *)&local_3f8,&local_408,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)local_348);
      boost::multiprecision::operator*((multiprecision *)&local_3e8,&local_14,&local_3f8);
      boost::multiprecision::operator*
                ((multiprecision *)&local_428,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2d0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2d0);
      local_430 = 1.0;
      boost::multiprecision::operator-((multiprecision *)&local_418,&local_428,&local_430);
      boost::multiprecision::operator/((multiprecision *)&local_3d8,&local_3e8,&local_418);
      this = &p1.m_backend.m_exponent;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)this,&local_3d8);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)&pp.m_backend.m_exponent,
                  (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)local_2d0);
      boost::multiprecision::operator/
                ((multiprecision *)&local_450,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)local_330,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)this);
      boost::multiprecision::operator-
                ((multiprecision *)&local_440,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&pp.m_backend.m_exponent,&local_450);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)local_2d0,&local_440);
      boost::multiprecision::operator-
                ((multiprecision *)&local_470,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2d0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&pp.m_backend.m_exponent);
      boost::multiprecision::
      abs<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                ((multiprecision *)&local_460,&local_470);
      local_478 = 1e-17;
      tVar2 = boost::multiprecision::operator>(&local_460,&local_478);
    } while (tVar2);
    local_490 = 0.5;
    local_4a4 = 1;
    boost::multiprecision::operator-
              ((multiprecision *)&local_4a0,&local_4a4,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)local_2d0);
    boost::multiprecision::operator*((multiprecision *)&local_488,&local_490,&local_4a0);
    dVar5 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            ::convert_to<double>(&local_488);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,(ulong)(uint)z.m_backend.m_exponent);
    *pSVar4 = dVar5;
    local_4c0 = 0.5;
    local_4d4 = 1;
    boost::multiprecision::operator+
              ((multiprecision *)&local_4d0,&local_4d4,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)local_2d0);
    boost::multiprecision::operator*((multiprecision *)&local_4b8,&local_4c0,&local_4d0);
    dVar5 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            ::convert_to<double>(&local_4b8);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,(ulong)(~z.m_backend.m_exponent + local_14));
    *pSVar4 = dVar5;
    local_4f0 = 1.0;
    local_528 = 1.0;
    boost::multiprecision::operator*
              ((multiprecision *)&local_538,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)local_2d0,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)local_2d0);
    boost::multiprecision::operator-((multiprecision *)&local_520,&local_528,&local_538);
    boost::multiprecision::operator*
              ((multiprecision *)&local_510,&local_520,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&p1.m_backend.m_exponent);
    boost::multiprecision::operator*
              ((multiprecision *)&local_500,&local_510,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&p1.m_backend.m_exponent);
    boost::multiprecision::operator/((multiprecision *)&local_4e8,&local_4f0,&local_500);
    dVar5 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            ::convert_to<double>(&local_4e8);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&i,
                        (ulong)(uint)z.m_backend.m_exponent);
    *pSVar4 = dVar5;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&i,
                        (ulong)(uint)z.m_backend.m_exponent);
    SVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&i,
                        (ulong)(~z.m_backend.m_exponent + local_14));
    *pSVar4 = SVar1;
  }
  std::tuple<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
  tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_true>
            (__return_storage_ptr__,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             &weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)&i);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&i);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Eigen::VectorXd, Eigen::VectorXd> GaussLegendre(
    unsigned num_points) {
  LF_ASSERT_MSG(num_points > 0, "num_points must be positive.");

  using scalar_t =
      boost::multiprecision::number<boost::multiprecision::cpp_bin_float<
          57, boost::multiprecision::digit_base_2>>;

  static const scalar_t kPi = boost::math::constants::pi<scalar_t>();

  Eigen::VectorXd points(num_points);
  Eigen::VectorXd weights(num_points);

  // the roots are symmetric in the interval, so we only have to find half of
  // them
  const unsigned int m = (num_points + 1) / 2;

  // approximation for the roots:
  for (unsigned int i = 0; i < m; ++i) {
    // initial guess for the i-th root:
    scalar_t z = cos(kPi * (i + 0.75) / (num_points + 0.5));
    scalar_t z1;
    scalar_t pp;

    // start of newton
    do {
      // calculate value of legendre polynomial at z using recurrence relation:
      scalar_t p1 = 1.0;
      scalar_t p2 = 0.0;
      scalar_t p3;

      for (unsigned int j = 0; j < num_points; ++j) {
        p3 = p2;
        p2 = p1;
        p1 = ((2.0 * j + 1.) * z * p2 - j * p3) / (j + 1.);
      }

      // p1 is now the value of the legendre polynomial at z. Next we compute
      // its derivative using a standard relation involving also p2, the
      // polynomial of one lower order:
      pp = num_points * (z * p1 - p2) / (z * z - 1.0);

      z1 = z;
      z = z1 - p1 / pp;
    } while (abs(z - z1) > 1e-17);

    points(i) = (0.5 * (1 - z)).convert_to<double>();
    points(num_points - 1 - i) = (0.5 * (1 + z)).convert_to<double>();
    weights(i) = (1. / ((1.0 - z * z) * pp * pp)).convert_to<double>();
    weights(num_points - 1 - i) = weights(i);
  }

  return {std::move(points), std::move(weights)};
}